

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityTestOutput.cpp
# Opt level: O0

void __thiscall
TeamCityTestOutput::printCurrentTestStarted(TeamCityTestOutput *this,UtestShell *test)

{
  char *pcVar1;
  ulong uVar2;
  long *in_RSI;
  long *in_RDI;
  UtestShell *in_stack_ffffffffffffffa8;
  UtestShell *this_00;
  undefined1 local_30 [48];
  
  local_30._32_8_ = in_RSI;
  (**(code **)(*in_RDI + 0x58))(in_RDI,"##teamcity[testStarted name=\'");
  UtestShell::getName(in_stack_ffffffffffffffa8);
  pcVar1 = SimpleString::asCharString((SimpleString *)(local_30 + 0x18));
  (**(code **)(*in_RDI + 0x58))(in_RDI,pcVar1);
  SimpleString::~SimpleString((SimpleString *)0x20f1fc);
  (**(code **)(*in_RDI + 0x58))(in_RDI,"\']\n");
  uVar2 = (**(code **)(*(long *)local_30._32_8_ + 0x30))();
  if ((uVar2 & 1) == 0) {
    (**(code **)(*in_RDI + 0x58))(in_RDI,"##teamcity[testIgnored name=\'");
    this_00 = (UtestShell *)local_30;
    UtestShell::getName(this_00);
    pcVar1 = SimpleString::asCharString((SimpleString *)this_00);
    (**(code **)(*in_RDI + 0x58))(in_RDI,pcVar1);
    SimpleString::~SimpleString((SimpleString *)0x20f278);
    (**(code **)(*in_RDI + 0x58))(in_RDI,"\']\n");
  }
  in_RDI[3] = local_30._32_8_;
  return;
}

Assistant:

void TeamCityTestOutput::printCurrentTestStarted(const UtestShell& test)
{
    print("##teamcity[testStarted name='");
    print(test.getName().asCharString());
    print("']\n");
    if (!test.willRun()) {
        print("##teamcity[testIgnored name='");
        print(test.getName().asCharString());
        print("']\n");
    }
    currtest_ = &test;
}